

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall
TTD::EventLog::GetSnapShotBoundInterval
          (EventLog *this,int64 targetTime,int64 *snapIntervalStart,int64 *snapIntervalEnd)

{
  bool bVar1;
  EventLogEntry *pEVar2;
  SnapshotEventLogEntry *pSVar3;
  SnapshotEventLogEntry *snapEvent_1;
  EventLogEntry *evt_1;
  SnapshotEventLogEntry *snapEvent;
  EventLogEntry *evt;
  Iterator iter;
  int64 *snapIntervalEnd_local;
  int64 *snapIntervalStart_local;
  int64 targetTime_local;
  EventLog *this_local;
  
  *snapIntervalStart = -1;
  *snapIntervalEnd = -1;
  iter.m_previousEventMap =
       (BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)snapIntervalEnd;
  TTEventList::GetIteratorAtLast_ReplayOnly((Iterator *)&evt,&this->m_eventList);
  do {
    bVar1 = TTEventList::Iterator::IsValid((Iterator *)&evt);
    if (!bVar1) {
LAB_00ca0ce8:
      do {
        bVar1 = TTEventList::Iterator::IsValid((Iterator *)&evt);
        if (!bVar1) {
          return;
        }
        pEVar2 = TTEventList::Iterator::Current((Iterator *)&evt);
        if (pEVar2->EventKind == SnapshotTag) {
          pEVar2 = TTEventList::Iterator::Current((Iterator *)&evt);
          pSVar3 = NSLogEvents::
                   GetInlineEventDataAs<TTD::NSLogEvents::SnapshotEventLogEntry,(TTD::NSLogEvents::EventKind)1>
                             (pEVar2);
          if (*snapIntervalStart < pSVar3->RestoreTimestamp) {
            (iter.m_previousEventMap)->buckets = (Type)pSVar3->RestoreTimestamp;
            return;
          }
        }
        TTEventList::Iterator::MoveNext((Iterator *)&evt);
      } while( true );
    }
    pEVar2 = TTEventList::Iterator::Current((Iterator *)&evt);
    if (pEVar2->EventKind == SnapshotTag) {
      pEVar2 = TTEventList::Iterator::Current((Iterator *)&evt);
      pSVar3 = NSLogEvents::
               GetInlineEventDataAs<TTD::NSLogEvents::SnapshotEventLogEntry,(TTD::NSLogEvents::EventKind)1>
                         (pEVar2);
      if (pSVar3->RestoreTimestamp <= targetTime) {
        *snapIntervalStart = pSVar3->RestoreTimestamp;
        goto LAB_00ca0ce8;
      }
    }
    TTEventList::Iterator::MovePrevious_ReplayOnly((Iterator *)&evt);
  } while( true );
}

Assistant:

void EventLog::GetSnapShotBoundInterval(int64 targetTime, int64* snapIntervalStart, int64* snapIntervalEnd) const
    {
        *snapIntervalStart = -1;
        *snapIntervalEnd = -1;

        //move the iterator to the current snapshot just before the event
        auto iter = this->m_eventList.GetIteratorAtLast_ReplayOnly();
        while(iter.IsValid())
        {
            NSLogEvents::EventLogEntry* evt = iter.Current();
            if(evt->EventKind == NSLogEvents::EventKind::SnapshotTag)
            {
                NSLogEvents::SnapshotEventLogEntry* snapEvent = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(iter.Current());
                if(snapEvent->RestoreTimestamp <= targetTime)
                {
                    *snapIntervalStart = snapEvent->RestoreTimestamp;
                    break;
                }
            }

            iter.MovePrevious_ReplayOnly();
        }

        //now move the iter to the next snapshot
        while(iter.IsValid())
        {
            NSLogEvents::EventLogEntry* evt = iter.Current();
            if(evt->EventKind == NSLogEvents::EventKind::SnapshotTag)
            {
                NSLogEvents::SnapshotEventLogEntry* snapEvent = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(iter.Current());
                if(*snapIntervalStart < snapEvent->RestoreTimestamp)
                {
                    *snapIntervalEnd = snapEvent->RestoreTimestamp;
                    break;
                }
            }

            iter.MoveNext();
        }
    }